

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::merkle_tree::blocks_verified(merkle_tree *this,int block_idx,int num_blocks)

{
  bool bVar1;
  int iVar2;
  int i;
  bool bVar3;
  
  switch(this->m_mode) {
  case empty_tree:
    bVar3 = this->m_num_blocks == 1;
    break;
  case full_tree:
    iVar2 = num_blocks + block_idx;
    do {
      bVar3 = iVar2 <= block_idx;
      if (iVar2 <= block_idx) {
        return bVar3;
      }
      bVar1 = bitfield::get_bit(&this->m_block_verified,block_idx);
      block_idx = block_idx + 1;
    } while (bVar1);
    break;
  case piece_layer:
    bVar3 = this->m_blocks_per_piece_log == '\0';
    break;
  case block_layer:
    bVar3 = true;
    break;
  default:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool merkle_tree::blocks_verified(int block_idx, int num_blocks) const
	{
		TORRENT_ASSERT(num_blocks > 0);
		TORRENT_ASSERT(block_idx < m_num_blocks);
		TORRENT_ASSERT(block_idx + num_blocks <= m_num_blocks);
		switch (m_mode)
		{
			case mode_t::uninitialized_tree:
				return false;
			case mode_t::empty_tree:
				return m_num_blocks == 1;
			case mode_t::piece_layer:
				return piece_levels() == 0;
			case mode_t::block_layer:
				return true;
			case mode_t::full_tree:
				for (int i = block_idx; i < block_idx + num_blocks; ++i)
					if (!m_block_verified.get_bit(i)) return false;
				return true;
		}
		TORRENT_ASSERT_FAIL();
		return false;
	}